

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

ON_Brep * ON_BrepBox(ON_3dPoint *box_corners,ON_Brep *pBrep)

{
  ON_CurveArray *this;
  long lVar1;
  ulong uVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ON_BrepVertex *pOVar6;
  ON_BrepEdge *pOVar7;
  ON_Surface *pOVar8;
  ON_3dPoint vertex_point;
  uint uVar9;
  int iVar10;
  ON_Brep *this_00;
  ON_LineCurve *pOVar11;
  ulong uVar12;
  ulong uVar13;
  ON_NurbsSurface *pS;
  double *pdVar14;
  ON_BrepFace *face;
  ON_BrepLoop *loop;
  ON_BrepTrim *pOVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval s;
  ON_Interval t;
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON_2dPoint p3;
  ON_2dPoint p2;
  ON_Interval local_c0;
  int local_ac;
  int local_a8;
  int local_a4;
  ON_Brep *local_a0;
  ON_BrepEdge *local_98;
  long local_90;
  ON_BrepEdge *local_88;
  ON_Interval local_80;
  ON_2dPoint local_70;
  ON_2dPoint local_60;
  ON_2dPoint local_50;
  ON_2dPoint local_40;
  
  if (box_corners != (ON_3dPoint *)0x0) {
    if (pBrep == (ON_Brep *)0x0) {
      this_00 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(this_00);
    }
    else {
      ON_Brep::Destroy(pBrep);
      this_00 = pBrep;
    }
    if ((uint)(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < 0x18) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x18);
    }
    this = &this_00->m_C3;
    if ((uint)(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < 0xc) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&this->super_ON_SimpleArray<ON_Curve_*>,0xc);
    }
    if ((uint)(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < 6) {
      ON_SimpleArray<ON_Surface_*>::SetCapacity
                (&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,6);
    }
    if ((uint)(this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
              m_capacity < 8) {
      ON_ClassArray<ON_BrepVertex>::SetCapacity((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,8);
    }
    if ((uint)(this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              m_capacity < 0xc) {
      ON_ClassArray<ON_BrepEdge>::SetCapacity((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,0xc);
    }
    if ((uint)(this_00->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
              m_capacity < 6) {
      ON_ClassArray<ON_BrepLoop>::SetCapacity((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,6);
    }
    if ((uint)(this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
              m_capacity < 0x18) {
      ON_ClassArray<ON_BrepTrim>::SetCapacity((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,0x18);
    }
    local_a0 = pBrep;
    if ((uint)(this_00->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
              m_capacity < 6) {
      ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,6);
    }
    lVar17 = 0;
    do {
      vertex_point.z = *(double *)((long)&box_corners->z + lVar17);
      vertex_point._0_16_ = *(undefined1 (*) [16])((long)&box_corners->x + lVar17);
      ON_Brep::NewVertex(this_00,vertex_point,0.0);
      lVar17 = lVar17 + 0x18;
    } while (lVar17 != 0xc0);
    lVar18 = 0;
    lVar17 = 0;
    do {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      lVar1 = lVar17 + 1;
      uVar9 = (uint)lVar1 & 3;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)((long)&(pOVar6->super_ON_Point).point.x + lVar18),
                 &pOVar6[uVar9].super_ON_Point.point);
      local_c0.m_t[0] = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_c0);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar18),pOVar6 + uVar9,(int)lVar17,
                       (ON_Interval *)0x0,0.0);
      lVar18 = lVar18 + 0x58;
      lVar17 = lVar1;
    } while (lVar1 != 4);
    lVar17 = 0x160;
    uVar12 = 4;
    do {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      uVar2 = uVar12 + 1;
      uVar13 = uVar2 & 0xffffffff;
      if (lVar17 == 0x268) {
        uVar13 = 4;
      }
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)((long)&(pOVar6->super_ON_Point).point.x + lVar17),
                 &pOVar6[uVar13].super_ON_Point.point);
      local_c0.m_t[0] = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_c0);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar17),pOVar6 + uVar13,(int)uVar12,
                       (ON_Interval *)0x0,0.0);
      lVar17 = lVar17 + 0x58;
      uVar12 = uVar2;
    } while (uVar2 != 8);
    iVar16 = 8;
    lVar17 = 0x10;
    do {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)
                         ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                 _vptr_ON_Object + lVar17),
                 (ON_3dPoint *)
                 ((long)&pOVar6[4].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object
                 + lVar17));
      local_c0.m_t[0] = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_c0);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)((long)pOVar6 + lVar17 + -0x10),
                       (ON_BrepVertex *)((long)&pOVar6[3].m_ei.m_count + lVar17),iVar16,
                       (ON_Interval *)0x0,0.0);
      iVar16 = iVar16 + 1;
      lVar17 = lVar17 + 0x58;
    } while (lVar17 != 0x170);
    lVar17 = 0x1c;
    do {
      iVar16 = *(int *)((long)&DAT_006b7640 + lVar17 + 4);
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar7 = (this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
      ;
      iVar4 = *(int *)(&DAT_006b7648 + lVar17);
      local_88 = pOVar7 + *(int *)(&UNK_006b764c + lVar17);
      local_98 = pOVar7 + *(int *)((long)&switchD_00413a8f::switchdataD_006b7650 + lVar17);
      iVar5 = *(int *)((long)&UINT_006b7654 + lVar17);
      local_a4 = *(int *)((long)&UINT_006b7658 + lVar17);
      local_a8 = *(int *)((long)&UINT_006b765c + lVar17);
      local_ac = *(int *)((long)&DAT_006b7660 + lVar17);
      local_90 = lVar17;
      pS = ON_NurbsSurfaceQuadrilateral
                     (&pOVar6[pOVar7[iVar16].m_vi[iVar5 != 0]].super_ON_Point.point,
                      &pOVar6[pOVar7[iVar4].m_vi[local_a4 != 0]].super_ON_Point.point,
                      &pOVar6[local_88->m_vi[local_a8 != 0]].super_ON_Point.point,
                      &pOVar6[local_98->m_vi[local_ac != 0]].super_ON_Point.point,
                      (ON_NurbsSurface *)0x0);
      iVar10 = ON_Brep::AddSurface(this_00,&pS->super_ON_Surface);
      pOVar8 = (this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar10];
      (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar8,0);
      local_c0.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_c0.m_t[1] = in_XMM1_Qa;
      (*((this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar10]->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x26])();
      local_80.m_t[1] = in_XMM1_Qa;
      pdVar14 = ON_Interval::operator[](&local_c0,0);
      dVar3 = *pdVar14;
      pdVar14 = ON_Interval::operator[](&local_80,0);
      ON_2dPoint::ON_2dPoint(&local_60,dVar3,*pdVar14);
      pdVar14 = ON_Interval::operator[](&local_c0,1);
      dVar3 = *pdVar14;
      pdVar14 = ON_Interval::operator[](&local_80,0);
      ON_2dPoint::ON_2dPoint(&local_70,dVar3,*pdVar14);
      pdVar14 = ON_Interval::operator[](&local_c0,1);
      dVar3 = *pdVar14;
      pdVar14 = ON_Interval::operator[](&local_80,1);
      ON_2dPoint::ON_2dPoint(&local_40,dVar3,*pdVar14);
      pdVar14 = ON_Interval::operator[](&local_c0,0);
      dVar3 = *pdVar14;
      pdVar14 = ON_Interval::operator[](&local_80,1);
      in_XMM1_Qa = *pdVar14;
      ON_2dPoint::ON_2dPoint(&local_50,dVar3,in_XMM1_Qa);
      face = ON_Brep::NewFace(this_00,iVar10);
      loop = ON_Brep::NewLoop(this_00,outer,face);
      pdVar14 = ON_Interval::operator[](&local_c0,0);
      (loop->m_pbox).m_min.x = *pdVar14;
      pdVar14 = ON_Interval::operator[](&local_80,0);
      (loop->m_pbox).m_min.y = *pdVar14;
      (loop->m_pbox).m_min.z = 0.0;
      pdVar14 = ON_Interval::operator[](&local_c0,1);
      (loop->m_pbox).m_max.x = *pdVar14;
      pdVar14 = ON_Interval::operator[](&local_80,1);
      (loop->m_pbox).m_max.y = *pdVar14;
      (loop->m_pbox).m_max.z = 0.0;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar11,&local_60,&local_70);
      iVar10 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
      pOVar15 = ON_Brep::NewTrim(this_00,pOVar7 + iVar16,iVar5 != 0,loop,iVar10);
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar19 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar19 + 2 + (uint)bVar19;
      pOVar15->m_iso = S_iso;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar11,&local_70,&local_40);
      bVar19 = local_a4 != 0;
      iVar16 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
      pOVar15 = ON_Brep::NewTrim(this_00,pOVar7 + iVar4,bVar19,loop,iVar16);
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar19 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar19 + 2 + (uint)bVar19;
      pOVar15->m_iso = E_iso;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar11,&local_40,&local_50);
      bVar19 = local_a8 != 0;
      iVar16 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
      pOVar15 = ON_Brep::NewTrim(this_00,local_88,bVar19,loop,iVar16);
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar19 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar19 + 2 + (uint)bVar19;
      pOVar15->m_iso = N_iso;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar11,&local_50,&local_60);
      bVar19 = local_ac != 0;
      iVar16 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
      pOVar15 = ON_Brep::NewTrim(this_00,local_98,bVar19,loop,iVar16);
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar19 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar19 + 2 + (uint)bVar19;
      pOVar15->m_iso = W_iso;
      lVar17 = local_90 + 0x20;
    } while (lVar17 != 0xdc);
    iVar16 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this_00,0);
    if ((char)iVar16 != '\0') {
      return this_00;
    }
    if (local_a0 == (ON_Brep *)0x0) {
      (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
    }
    else {
      ON_Brep::Destroy(local_a0);
    }
  }
  return (ON_Brep *)0x0;
}

Assistant:

ON_Brep* ON_BrepBox( const ON_3dPoint* box_corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;
  int vi, ei, fi, si, c2i;
  if (box_corners)
  {
    if ( pBrep ) {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    brep->m_C2.Reserve(24);
    brep->m_C3.Reserve(12);
    brep->m_S.Reserve(6);
    brep->m_V.Reserve(8);
    brep->m_E.Reserve(12);
    brep->m_L.Reserve(6);
    brep->m_T.Reserve(24);
    brep->m_F.Reserve(6);
    for ( vi = 0; vi < 8; vi++ )
    {
      brep->NewVertex( box_corners[vi], 0.0 );
    }
    for ( ei = 0; ei < 4; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%4];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    for ( ei = 4; ei < 8; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==7?4:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    for ( ei = 8; ei < 12; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-8];
      ON_BrepVertex& v1 = brep->m_V[ei-4];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //           v7_______e6_____v6
    //            |\             |\
    //            | e7           | e5
    //            |  \ ______e4_____\ 
    //           e11  v4         |   v5
    //            |   |        e10   |
    //            |   |          |   |
    //            3---|---e2-----2   e9
    //            \   e8         \   |
    //             e3 |           e1 |
    //              \ |            \ |
    //               \v0_____e0_____\v1
    */

    struct {
      int e[4], bRev[4];
    } f[6] = {
      {{0, 9, 4, 8},  {false, false, true,  true}},
      {{1,10, 5, 9},  {false, false, true,  true}},
      {{2,11, 6,10},  {false, false, true,  true}},
      {{3, 8, 7,11},  {false, false, true,  true}},
      {{3, 2, 1, 0},  {true,  true,  true,  true}},
      {{4, 5, 6, 7},  {false, false, false, false}}
    };
    for ( fi = 0; fi < 6; fi++ )
    {
      ON_BrepEdge& e0 = brep->m_E[f[fi].e[0]];
      ON_BrepEdge& e1 = brep->m_E[f[fi].e[1]];
      ON_BrepEdge& e2 = brep->m_E[f[fi].e[2]];
      ON_BrepEdge& e3 = brep->m_E[f[fi].e[3]];
      ON_BrepVertex& v0 = brep->m_V[e0.m_vi[f[fi].bRev[0]?1:0]];
      ON_BrepVertex& v1 = brep->m_V[e1.m_vi[f[fi].bRev[1]?1:0]];
      ON_BrepVertex& v2 = brep->m_V[e2.m_vi[f[fi].bRev[2]?1:0]];
      ON_BrepVertex& v3 = brep->m_V[e3.m_vi[f[fi].bRev[3]?1:0]];

      si = brep->AddSurface( ON_NurbsSurfaceQuadrilateral( v0.point, v1.point, v2.point, v3.point ) );
      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0(s[0],t[0]);
      ON_2dPoint p1(s[1],t[0]);
      ON_2dPoint p2(s[1],t[1]);
      ON_2dPoint p3(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      loop.m_pbox.m_min.x = s[0];
      loop.m_pbox.m_min.y = t[0];
      loop.m_pbox.m_min.z = 0.0;

      loop.m_pbox.m_max.x = s[1];
      loop.m_pbox.m_max.y = t[1];
      loop.m_pbox.m_max.z = 0.0;

      // south side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
      ON_BrepTrim& trim0 = brep->NewTrim( e0, f[fi].bRev[0], loop, c2i );
      trim0.m_tolerance[0] = 0.0;
      trim0.m_tolerance[1] = 0.0;
      trim0.m_type = (trim0.m_vi[0] != trim0.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim0.m_iso = ON_Surface::S_iso;

      // east side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
      ON_BrepTrim& trim1 = brep->NewTrim( e1, f[fi].bRev[1], loop, c2i );
      trim1.m_tolerance[0] = 0.0;
      trim1.m_tolerance[1] = 0.0;
      trim1.m_type = (trim1.m_vi[0] != trim1.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim1.m_iso = ON_Surface::E_iso;

      // north side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
      ON_BrepTrim& trim2 = brep->NewTrim( e2, f[fi].bRev[2], loop, c2i );
      trim2.m_tolerance[0] = 0.0;
      trim2.m_tolerance[1] = 0.0;
      trim2.m_type = (trim2.m_vi[0] != trim2.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim2.m_iso = ON_Surface::N_iso;

      // west side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
      ON_BrepTrim& trim3 = brep->NewTrim( e3, f[fi].bRev[3], loop, c2i );
      trim3.m_tolerance[0] = 0.0;
      trim3.m_tolerance[1] = 0.0;
      trim3.m_type = (trim3.m_vi[0] != trim3.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim3.m_iso = ON_Surface::W_iso;
    }
    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}